

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_GenOneHot(char *pFileName,int nVars)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  int nDigitsOut;
  int nDigitsIn;
  int Counter;
  int k;
  int i;
  FILE *pFile;
  int nVars_local;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"w");
  pcVar4 = Extra_TimeStamp();
  fprintf(__stream,"# One-hotness condition for %d vars generated by ABC on %s\n",(ulong)(uint)nVars
          ,pcVar4);
  fprintf(__stream,".model 1hot_%dvars\n",(ulong)(uint)nVars);
  fprintf(__stream,".inputs");
  uVar1 = Abc_Base10Log(nVars);
  for (Counter = 0; Counter < nVars; Counter = Counter + 1) {
    fprintf(__stream," i%0*d",(ulong)uVar1,(ulong)(uint)Counter);
  }
  fprintf(__stream,"\n");
  fprintf(__stream,".outputs");
  uVar2 = Abc_Base10Log((nVars * (nVars + -1)) / 2);
  for (Counter = 0; iVar3 = nVars * (nVars + -1), Counter < iVar3 / 2; Counter = Counter + 1) {
    fprintf(__stream," o%0*d",(ulong)uVar2,(ulong)(uint)Counter);
  }
  fprintf(__stream,"\n",(long)iVar3 % 2 & 0xffffffff);
  nDigitsOut = 0;
  for (Counter = 0; nDigitsIn = Counter, Counter < nVars; Counter = Counter + 1) {
    while (nDigitsIn = nDigitsIn + 1, nDigitsIn < nVars) {
      fprintf(__stream,".names i%0*d i%0*d o%0*d\n",(ulong)uVar1,(ulong)(uint)Counter,(ulong)uVar1,
              (ulong)(uint)nDigitsIn,uVar2,nDigitsOut);
      fprintf(__stream,"11 0\n");
      nDigitsOut = nDigitsOut + 1;
    }
  }
  fprintf(__stream,".end\n");
  fprintf(__stream,"\n");
  fclose(__stream);
  return;
}

Assistant:

void Abc_GenOneHot( char * pFileName, int nVars )
{
    FILE * pFile;
    int i, k, Counter, nDigitsIn, nDigitsOut;
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# One-hotness condition for %d vars generated by ABC on %s\n", nVars, Extra_TimeStamp() );
    fprintf( pFile, ".model 1hot_%dvars\n", nVars );
    fprintf( pFile, ".inputs" );
    nDigitsIn = Abc_Base10Log( nVars );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " i%0*d", nDigitsIn, i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    nDigitsOut = Abc_Base10Log( nVars * (nVars - 1) / 2 );
    for ( i = 0; i < nVars * (nVars - 1) / 2; i++ )
        fprintf( pFile, " o%0*d", nDigitsOut, i );
    fprintf( pFile, "\n" );
    Counter = 0;
    for ( i = 0; i < nVars; i++ )
        for ( k = i+1; k < nVars; k++ )
        {
            fprintf( pFile, ".names i%0*d i%0*d o%0*d\n", nDigitsIn, i, nDigitsIn, k, nDigitsOut, Counter ); 
            fprintf( pFile, "11 0\n" ); 
            Counter++;
        }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
    fclose( pFile );
}